

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mine.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::Mine::AddVertexToTripDetonationWire(Mine *this,KUINT16 Index,Vector *Vertex)

{
  iterator __position;
  KFLOAT32 KVar1;
  iterator iVar2;
  
  iVar2 = getWire(this,Index);
  __position._M_current = (Vector *)iVar2._M_node[1]._M_left;
  if ((_Base_ptr)__position._M_current != iVar2._M_node[1]._M_right) {
    ((__position._M_current)->super_DataTypeBase)._vptr_DataTypeBase =
         (_func_int **)&PTR__DataTypeBase_00224ed8;
    KVar1 = Vertex->m_f32Y;
    (__position._M_current)->m_f32X = Vertex->m_f32X;
    (__position._M_current)->m_f32Y = KVar1;
    (__position._M_current)->m_f32Z = Vertex->m_f32Z;
    iVar2._M_node[1]._M_left = (_Base_ptr)&(iVar2._M_node[1]._M_left)->_M_right;
    return;
  }
  std::vector<KDIS::DATA_TYPE::Vector,std::allocator<KDIS::DATA_TYPE::Vector>>::
  _M_realloc_insert<KDIS::DATA_TYPE::Vector_const&>
            ((vector<KDIS::DATA_TYPE::Vector,std::allocator<KDIS::DATA_TYPE::Vector>> *)
             &iVar2._M_node[1]._M_parent,__position,Vertex);
  return;
}

Assistant:

void Mine::AddVertexToTripDetonationWire(KUINT16 Index, const Vector &Vertex) noexcept(false)
{
    map< KUINT16, vector<Vector> >::iterator itr = getWire( Index );
    itr->second.push_back( Vertex );
}